

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O1

void __thiscall
ConfidentialTransactionContext_ConvertSignatureFromDer_Test::TestBody
          (ConfidentialTransactionContext_ConvertSignatureFromDer_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  ByteData sigm;
  SigHashType sighashtype;
  ByteData sig1;
  AssertHelper local_90;
  ByteData local_88;
  undefined1 *local_70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined1 local_60 [16];
  ByteData local_50;
  SigHashType local_34 [12];
  ByteData local_28;
  
  cfd::core::SigHashType::SigHashType(local_34);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "304402204f3ac1717f035b791005b12e41fba708d7d38cadfc4fd6ad1d53de2b4be5d416022045f743f06ff21fded63a2c7088cfe435e561dbc1c28283f0b4b152808914affd01"
             ,"");
  cfd::core::ByteData::ByteData(&local_50,(string *)&local_70);
  cfd::core::CryptoUtil::ConvertSignatureFromDer(&local_28,(SigHashType *)&local_50);
  if (local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "3043022020ea09b0108c4a4a5b2769c41dea7bd546d5fe32dcdcd4bcecc6645281fd684c021f105dddaff39cb0a18c0f5f04c8275801cc18e9fc5931fb2d8c0226d2c1fc5501"
             ,"");
  cfd::core::ByteData::ByteData(&local_88,(string *)&local_70);
  cfd::core::CryptoUtil::ConvertSignatureFromDer(&local_50,(SigHashType *)&local_88);
  if (local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_90.data_._0_4_ = 0x40;
  local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)cfd::core::ByteData::GetDataSize();
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_70,"64","sig1.GetDataSize()",(int *)&local_90,
             (unsigned_long *)&local_88);
  if (local_70._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x3a3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*(long *)local_88.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90.data_._0_4_ = 0x40;
  local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)cfd::core::ByteData::GetDataSize();
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_70,"64","sigm.GetDataSize()",(int *)&local_90,
             (unsigned_long *)&local_88);
  if (local_70._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x3a4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*(long *)local_88.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, ConvertSignatureFromDer)
{
  SigHashType sighashtype;
  // 4f3ac1717f035b791005b12e41fba708d7d38cadfc4fd6ad1d53de2b4be5d41645f743f06ff21fded63a2c7088cfe435e561dbc1c28283f0b4b152808914affd
  ByteData sig1 = CryptoUtil::ConvertSignatureFromDer(
      ByteData("304402204f3ac1717f035b791005b12e41fba708d7d38cadfc4fd6ad1d53de2b4be5d416022045f743f06ff21fded63a2c7088cfe435e561dbc1c28283f0b4b152808914affd01"), &sighashtype);
  // 20ea09b0108c4a4a5b2769c41dea7bd546d5fe32dcdcd4bcecc6645281fd684c00105dddaff39cb0a18c0f5f04c8275801cc18e9fc5931fb2d8c0226d2c1fc55
  ByteData sigm = CryptoUtil::ConvertSignatureFromDer(
      ByteData("3043022020ea09b0108c4a4a5b2769c41dea7bd546d5fe32dcdcd4bcecc6645281fd684c021f105dddaff39cb0a18c0f5f04c8275801cc18e9fc5931fb2d8c0226d2c1fc5501"), &sighashtype);
  EXPECT_EQ(64, sig1.GetDataSize());
  EXPECT_EQ(64, sigm.GetDataSize());
}